

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretrain.cc
# Opt level: O0

void dynet::save_pretrained_embeddings(string *fname,Dict *d,LookupParameter *lp)

{
  byte bVar1;
  uint uVar2;
  ostream *poVar3;
  invalid_argument *this;
  LookupParameterStorage *pLVar4;
  string *psVar5;
  LookupParameter *in_RDX;
  string *in_RDI;
  uint i;
  LookupParameterStorage *m;
  ostringstream oss;
  ofstream out;
  uint local_3d4;
  string local_3c0 [32];
  ostringstream local_3a0 [296];
  Tensor *in_stack_fffffffffffffd88;
  Dict *in_stack_fffffffffffffd90;
  long local_218 [2];
  DenseBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffdf8;
  ostream *in_stack_fffffffffffffe00;
  
  poVar3 = std::operator<<((ostream *)&std::cerr,"Writing word vectors to ");
  poVar3 = std::operator<<(poVar3,in_RDI);
  std::operator<<(poVar3," ...\n");
  std::ofstream::ofstream(local_218,in_RDI,_S_out);
  bVar1 = std::ios::operator!((ios *)((long)local_218 + *(long *)(local_218[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    pLVar4 = LookupParameter::get_storage(in_RDX);
    local_3d4 = 0;
    while( true ) {
      uVar2 = Dict::size((Dict *)0xd57782);
      if (uVar2 <= local_3d4) break;
      psVar5 = Dict::convert_abi_cxx11_(in_stack_fffffffffffffd90,(int *)in_stack_fffffffffffffd88);
      poVar3 = std::operator<<((ostream *)local_218,(string *)psVar5);
      poVar3 = std::operator<<(poVar3,' ');
      std::vector<dynet::Tensor,_std::allocator<dynet::Tensor>_>::operator[]
                (&pLVar4->values,(ulong)local_3d4);
      Tensor::operator*(in_stack_fffffffffffffd88);
      Eigen::
      DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
      transpose((DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)poVar3);
      poVar3 = Eigen::operator<<(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      local_3d4 = local_3d4 + 1;
    }
    std::ofstream::~ofstream(local_218);
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_3a0);
  poVar3 = std::operator<<((ostream *)local_3a0,"Could not save embeddings to ");
  std::operator<<(poVar3,in_RDI);
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::invalid_argument::invalid_argument(this,local_3c0);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void save_pretrained_embeddings(const std::string& fname,
    const Dict& d,
    const LookupParameter& lp) {
  cerr << "Writing word vectors to " << fname << " ...\n";
  ofstream out(fname);
  if(!out)
    DYNET_INVALID_ARG("Could not save embeddings to " << fname);
  auto& m = lp.get_storage();
  for (unsigned i = 0; i < d.size(); ++i) {
    out << d.convert(i) << ' ' << (*m.values[i]).transpose() << endl;
  }
}